

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Connection::handleDATA(QHttp2Connection *this)

{
  QLatin1StringView message;
  bool bVar1;
  State SVar2;
  quint32 qVar3;
  QFlagsStorage<Http2::FrameFlag> QVar4;
  QHttp2Stream *this_00;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  piter pVar5;
  QHttp2Stream *stream;
  const_iterator it;
  quint32 streamID;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff50;
  QHttp2Connection *in_stack_ffffffffffffff60;
  const_iterator *args_1;
  undefined4 in_stack_ffffffffffffff70;
  Http2Error in_stack_ffffffffffffff74;
  QHttp2Stream *in_stack_ffffffffffffff78;
  QHttp2Connection *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  quint32 in_stack_ffffffffffffff8c;
  char local_50 [52];
  quint32 local_1c;
  undefined8 local_18;
  undefined1 in_stack_fffffffffffffff0;
  undefined7 in_stack_fffffffffffffff1;
  char *pcVar6;
  
  pcVar6 = *(char **)(in_FS_OFFSET + 0x28);
  args_1 = in_RDI;
  local_1c = Http2::Frame::streamID((Frame *)0x2b73c7);
  if (local_1c == 0) {
    connectionError(in_stack_ffffffffffffff80,(Http2Error)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                    ,(char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    bVar1 = isInvalidStream(in_stack_ffffffffffffff60,in_stack_ffffffffffffff8c);
    if (bVar1) {
      connectionError(in_stack_ffffffffffffff80,
                      (Http2Error)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                      (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    else {
      this_00 = getStream(in_stack_ffffffffffffff60,in_stack_ffffffffffffff8c);
      SVar2 = QHttp2Stream::state((QHttp2Stream *)this_00);
      if ((SVar2 == HalfClosedRemote) ||
         (SVar2 = QHttp2Stream::state((QHttp2Stream *)this_00), SVar2 == Closed)) {
        QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
        message.m_size._1_7_ = in_stack_fffffffffffffff1;
        message.m_size._0_1_ = in_stack_fffffffffffffff0;
        message.m_data = pcVar6;
        QHttp2Stream::streamError(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,message);
      }
      else {
        qVar3 = Http2::Frame::payloadSize((Frame *)in_stack_ffffffffffffff50);
        if (*(int *)((long)&in_RDI[0x29].i.d + 4) < (int)qVar3) {
          local_18 = 0xaaaaaaaaaaaaaaaa;
          qHttp2ConnectionLog();
          anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    (in_stack_ffffffffffffff50,
                     (QLoggingCategory *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
            anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b7510);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)this_00,(char *)in_RDI,
                       (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (char *)0x2b7526);
            qVar3 = Http2::Frame::payloadSize((Frame *)in_stack_ffffffffffffff50);
            QMessageLogger::debug
                      (local_50,
                       "[%p] Received DATA frame with payload size %u, but recvWindow is %d, sending FLOW_CONTROL_ERROR"
                       ,in_RDI,(ulong)qVar3,(ulong)*(uint *)((long)&in_RDI[0x29].i.d + 4));
          }
          connectionError(in_stack_ffffffffffffff80,
                          (Http2Error)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        }
        else {
          qVar3 = Http2::Frame::payloadSize((Frame *)in_stack_ffffffffffffff50);
          *(quint32 *)((long)&in_RDI[0x29].i.d + 4) = *(int *)((long)&in_RDI[0x29].i.d + 4) - qVar3;
          QHash<unsigned_int,_QPointer<QHttp2Stream>_>::constFind
                    ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)in_stack_ffffffffffffff50,
                     (uint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          pVar5 = (piter)QHash<unsigned_int,_QPointer<QHttp2Stream>_>::cend
                                   ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)in_RDI);
          bVar1 = QHash<unsigned_int,_QPointer<QHttp2Stream>_>::const_iterator::operator!=
                            (in_RDI,(const_iterator *)in_stack_ffffffffffffff50);
          qVar3 = in_stack_ffffffffffffff4c & 0xffffff;
          if (bVar1) {
            QHash<unsigned_int,_QPointer<QHttp2Stream>_>::const_iterator::value
                      ((const_iterator *)0x2b761c);
            bVar1 = QPointer::operator_cast_to_bool((QPointer<QHttp2Stream> *)0x2b7624);
            qVar3 = CONCAT13(bVar1,(int3)qVar3);
          }
          if ((char)(qVar3 >> 0x18) != '\0') {
            QHash<unsigned_int,_QPointer<QHttp2Stream>_>::const_iterator::value
                      ((const_iterator *)0x2b763c);
            QPointer<QHttp2Stream>::operator->((QPointer<QHttp2Stream> *)0x2b7644);
            QHttp2Stream::handleDATA((QHttp2Stream *)pVar5.bucket,(Frame *)pVar5.d);
          }
          QVar4.i = (Int)Http2::Frame::flags((Frame *)in_stack_ffffffffffffff50);
          bVar1 = QFlags<Http2::FrameFlag>::testFlag
                            ((QFlags<Http2::FrameFlag> *)in_stack_ffffffffffffff50,
                             (FrameFlag)(qVar3 >> 0x18));
          if (bVar1) {
            receivedEND_STREAM((QHttp2Connection *)0x2b7693,qVar3);
          }
          if (*(int *)((long)&in_RDI[0x29].i.d + 4) < *(int *)&in_RDI[0x29].i.d / 2) {
            QMetaObject::
            invokeMethod<bool(QHttp2Connection::*)(unsigned_int,unsigned_int),unsigned_int,unsigned_int>
                      ((ContextType *)CONCAT44(QVar4.i,in_stack_ffffffffffffff88),
                       (offset_in_QHttp2Connection_to_subr *)0x0,AutoConnection,
                       (uint *)(ulong)(uint)(*(int *)&in_RDI[0x29].i.d -
                                            *(int *)((long)&in_RDI[0x29].i.d + 4)),(uint *)args_1);
            *(undefined4 *)((long)&in_RDI[0x29].i.d + 4) = *(undefined4 *)&in_RDI[0x29].i.d;
          }
        }
      }
    }
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar6) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::handleDATA()
{
    Q_ASSERT(inboundFrame.type() == FrameType::DATA);

    const auto streamID = inboundFrame.streamID();

    // RFC9113, 6.1: An endpoint that receives an unexpected stream identifier MUST respond
    // with a connection error.
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "DATA on the connection stream");

    if (isInvalidStream(streamID))
        return connectionError(ENHANCE_YOUR_CALM, "DATA on invalid stream");

    // RFC9113, 6.1: If a DATA frame is received whose stream is not in the "open" or
    // "half-closed (local)" state, the recipient MUST respond with a stream error.
    auto stream = getStream(streamID);
    if (stream->state() == QHttp2Stream::State::HalfClosedRemote
        || stream->state() == QHttp2Stream::State::Closed) {
        return stream->streamError(Http2Error::STREAM_CLOSED,
                                   QLatin1String("Data on closed stream"));
    }

    if (qint32(inboundFrame.payloadSize()) > sessionReceiveWindowSize) {
        qCDebug(qHttp2ConnectionLog,
                "[%p] Received DATA frame with payload size %u, "
                "but recvWindow is %d, sending FLOW_CONTROL_ERROR",
                this, inboundFrame.payloadSize(), sessionReceiveWindowSize);
        return connectionError(FLOW_CONTROL_ERROR, "Flow control error");
    }

    sessionReceiveWindowSize -= inboundFrame.payloadSize();

    auto it = m_streams.constFind(streamID);
    if (it != m_streams.cend() && it.value())
        it.value()->handleDATA(inboundFrame);

    if (inboundFrame.flags().testFlag(FrameFlag::END_STREAM))
        emit receivedEND_STREAM(streamID);

    if (sessionReceiveWindowSize < maxSessionReceiveWindowSize / 2) {
        // @future[consider]: emit signal instead
        QMetaObject::invokeMethod(this, &QHttp2Connection::sendWINDOW_UPDATE, Qt::QueuedConnection,
                                  quint32(connectionStreamID),
                                  quint32(maxSessionReceiveWindowSize - sessionReceiveWindowSize));
        sessionReceiveWindowSize = maxSessionReceiveWindowSize;
    }
}